

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  Extension *pEVar2;
  MessageLite *pMVar3;
  Nonnull<const_char_*> pcVar4;
  undefined1 *v1;
  ExtensionSet *const_this;
  undefined1 auStack_38 [16];
  
  v1 = auStack_38;
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar2->is_repeated == false) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    UnsafeArenaReleaseMessage();
    goto LAB_00f86278;
  }
  if ((byte)(pEVar2->type - 0x13) < 0xee) {
    UnsafeArenaReleaseMessage((ExtensionSet *)auStack_38);
LAB_00f86257:
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1,10,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE"
                       );
  }
  else {
    v1 = (undefined1 *)
         (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4);
    if (v1 != &DAT_0000000a) goto LAB_00f86257;
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((pEVar2->field_0xa & 4) == 0) {
      pMVar3 = (MessageLite *)(pEVar2->field_0).int64_t_value;
    }
    else {
      pAVar1 = this->arena_;
      pMVar3 = (MessageLite *)
               (**(code **)(**(long **)&(pEVar2->field_0).int32_t_value + 0x48))
                         (*(long **)&(pEVar2->field_0).int32_t_value,prototype,pAVar1);
      if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0)) {
        (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
      }
    }
    Erase(this,number);
    return pMVar3;
  }
LAB_00f86278:
  UnsafeArenaReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    int number, const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->UnsafeArenaReleaseMessage(
          prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      ret = extension->ptr.message_value;
    }
    Erase(number);
    return ret;
  }
}